

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void clearAllObjects(void)

{
  shared_ptr<MasterObjectHolder> holder;
  undefined8 local_18;
  undefined8 local_10;
  
  getMasterHolder();
  if (local_18 != (MasterObjectHolder *)0x0) {
    MasterObjectHolder::deleteAll(local_18);
  }
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
    return;
  }
  return;
}

Assistant:

void clearAllObjects()
{
    auto holder = getMasterHolder();
    if (holder) {
        holder->deleteAll();
    }
}